

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O0

void __thiscall
rr::FragmentProcessor::executeDepthCompare
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,TestFunc depthFunc,ConstPixelBufferAccess *depthBuffer)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  TextureFormat *pTVar4;
  Fragment *pFVar5;
  uint *puVar6;
  float fVar7;
  float fVar8;
  undefined1 local_4ac [24];
  deUint32 sampleDepth_15;
  PixelBufferAccess access_7;
  deUint32 buffer_7 [2];
  float sampleDepthFloat_15;
  deUint32 depthBufferValue_15;
  Fragment *frag_15;
  int local_440;
  int fragSampleNdx_15;
  int regSampleNdx_15;
  uint local_42c;
  undefined1 local_428 [4];
  deUint32 sampleDepth_14;
  PixelBufferAccess access_6;
  deUint32 buffer_6 [2];
  float sampleDepthFloat_14;
  deUint32 depthBufferValue_14;
  Fragment *frag_14;
  int local_3d0;
  int fragSampleNdx_14;
  int regSampleNdx_14;
  uint local_3bc;
  undefined1 local_3b8 [4];
  deUint32 sampleDepth_13;
  PixelBufferAccess access_5;
  deUint32 buffer_5 [2];
  float sampleDepthFloat_13;
  deUint32 depthBufferValue_13;
  Fragment *frag_13;
  int local_360;
  int fragSampleNdx_13;
  int regSampleNdx_13;
  uint local_34c;
  undefined1 local_348 [4];
  deUint32 sampleDepth_12;
  PixelBufferAccess access_4;
  deUint32 buffer_4 [2];
  float sampleDepthFloat_12;
  deUint32 depthBufferValue_12;
  Fragment *frag_12;
  int local_2f0;
  int fragSampleNdx_12;
  int regSampleNdx_12;
  uint local_2dc;
  undefined1 local_2d8 [4];
  deUint32 sampleDepth_11;
  PixelBufferAccess access_3;
  deUint32 buffer_3 [2];
  float sampleDepthFloat_11;
  deUint32 depthBufferValue_11;
  Fragment *frag_11;
  int local_280;
  int fragSampleNdx_11;
  int regSampleNdx_11;
  uint local_26c;
  undefined1 local_268 [4];
  deUint32 sampleDepth_10;
  PixelBufferAccess access_2;
  deUint32 buffer_2 [2];
  float sampleDepthFloat_10;
  deUint32 depthBufferValue_10;
  Fragment *frag_10;
  int local_210;
  int fragSampleNdx_10;
  int regSampleNdx_10;
  uint local_1fc;
  undefined1 local_1f8 [4];
  deUint32 sampleDepth_9;
  PixelBufferAccess access_1;
  deUint32 buffer_1 [2];
  float sampleDepthFloat_9;
  deUint32 depthBufferValue_9;
  Fragment *frag_9;
  int local_1a0;
  int fragSampleNdx_9;
  int regSampleNdx_9;
  uint local_18c;
  undefined1 local_188 [4];
  deUint32 sampleDepth_8;
  PixelBufferAccess access;
  deUint32 buffer [2];
  float sampleDepthFloat_8;
  deUint32 depthBufferValue_8;
  Fragment *frag_8;
  int local_130;
  int fragSampleNdx_8;
  int regSampleNdx_8;
  float sampleDepth_7;
  float sampleDepthFloat_7;
  float depthBufferValue_7;
  Fragment *frag_7;
  int local_110;
  int fragSampleNdx_7;
  int regSampleNdx_7;
  float sampleDepth_6;
  float sampleDepthFloat_6;
  float depthBufferValue_6;
  Fragment *frag_6;
  int local_f0;
  int fragSampleNdx_6;
  int regSampleNdx_6;
  float sampleDepth_5;
  float sampleDepthFloat_5;
  float depthBufferValue_5;
  Fragment *frag_5;
  int local_d0;
  int fragSampleNdx_5;
  int regSampleNdx_5;
  float sampleDepth_4;
  float sampleDepthFloat_4;
  float depthBufferValue_4;
  Fragment *frag_4;
  int local_b0;
  int fragSampleNdx_4;
  int regSampleNdx_4;
  float sampleDepth_3;
  float sampleDepthFloat_3;
  float depthBufferValue_3;
  Fragment *frag_3;
  int local_90;
  int fragSampleNdx_3;
  int regSampleNdx_3;
  float sampleDepth_2;
  float sampleDepthFloat_2;
  float depthBufferValue_2;
  Fragment *frag_2;
  int local_70;
  int fragSampleNdx_2;
  int regSampleNdx_2;
  float sampleDepth_1;
  float sampleDepthFloat_1;
  float depthBufferValue_1;
  Fragment *frag_1;
  int local_50;
  int fragSampleNdx_1;
  int regSampleNdx_1;
  float sampleDepth;
  float sampleDepthFloat;
  float depthBufferValue;
  Fragment *frag;
  int fragSampleNdx;
  int regSampleNdx;
  ConstPixelBufferAccess *depthBuffer_local;
  TestFunc depthFunc_local;
  Fragment *inputFragments_local;
  int numSamplesPerFragment_local;
  int fragNdxOffset_local;
  FragmentProcessor *this_local;
  
  pTVar4 = tcu::ConstPixelBufferAccess::getFormat(depthBuffer);
  if ((pTVar4->type == FLOAT) ||
     (pTVar4 = tcu::ConstPixelBufferAccess::getFormat(depthBuffer),
     pTVar4->type == FLOAT_UNSIGNED_INT_24_8_REV)) {
    switch(depthFunc) {
    case TESTFUNC_NEVER:
      for (frag._4_4_ = 0; frag._4_4_ < 0x40; frag._4_4_ = frag._4_4_ + 1) {
        if ((this->m_sampleRegister[frag._4_4_].isAlive & 1U) != 0) {
          pFVar5 = inputFragments + (fragNdxOffset + frag._4_4_ / numSamplesPerFragment);
          iVar2 = tcu::Vector<int,_2>::x(&pFVar5->pixelCoord);
          iVar3 = tcu::Vector<int,_2>::y(&pFVar5->pixelCoord);
          tcu::ConstPixelBufferAccess::getPixDepth
                    (depthBuffer,frag._4_4_ % numSamplesPerFragment,iVar2,iVar3);
          de::clamp<float>(pFVar5->sampleDepths[frag._4_4_ % numSamplesPerFragment],0.0,1.0);
          this->m_sampleRegister[frag._4_4_].depthPassed = false;
        }
      }
      break;
    case TESTFUNC_ALWAYS:
      for (local_50 = 0; local_50 < 0x40; local_50 = local_50 + 1) {
        if ((this->m_sampleRegister[local_50].isAlive & 1U) != 0) {
          pFVar5 = inputFragments + (fragNdxOffset + local_50 / numSamplesPerFragment);
          iVar2 = tcu::Vector<int,_2>::x(&pFVar5->pixelCoord);
          iVar3 = tcu::Vector<int,_2>::y(&pFVar5->pixelCoord);
          tcu::ConstPixelBufferAccess::getPixDepth
                    (depthBuffer,local_50 % numSamplesPerFragment,iVar2,iVar3);
          de::clamp<float>(pFVar5->sampleDepths[local_50 % numSamplesPerFragment],0.0,1.0);
          this->m_sampleRegister[local_50].depthPassed = true;
        }
      }
      break;
    case TESTFUNC_LESS:
      for (local_70 = 0; local_70 < 0x40; local_70 = local_70 + 1) {
        if ((this->m_sampleRegister[local_70].isAlive & 1U) != 0) {
          pFVar5 = inputFragments + (fragNdxOffset + local_70 / numSamplesPerFragment);
          iVar2 = tcu::Vector<int,_2>::x(&pFVar5->pixelCoord);
          iVar3 = tcu::Vector<int,_2>::y(&pFVar5->pixelCoord);
          fVar7 = tcu::ConstPixelBufferAccess::getPixDepth
                            (depthBuffer,local_70 % numSamplesPerFragment,iVar2,iVar3);
          fVar8 = de::clamp<float>(pFVar5->sampleDepths[local_70 % numSamplesPerFragment],0.0,1.0);
          this->m_sampleRegister[local_70].depthPassed = fVar8 < fVar7;
        }
      }
      break;
    case TESTFUNC_LEQUAL:
      for (local_90 = 0; local_90 < 0x40; local_90 = local_90 + 1) {
        if ((this->m_sampleRegister[local_90].isAlive & 1U) != 0) {
          pFVar5 = inputFragments + (fragNdxOffset + local_90 / numSamplesPerFragment);
          iVar2 = tcu::Vector<int,_2>::x(&pFVar5->pixelCoord);
          iVar3 = tcu::Vector<int,_2>::y(&pFVar5->pixelCoord);
          fVar7 = tcu::ConstPixelBufferAccess::getPixDepth
                            (depthBuffer,local_90 % numSamplesPerFragment,iVar2,iVar3);
          fVar8 = de::clamp<float>(pFVar5->sampleDepths[local_90 % numSamplesPerFragment],0.0,1.0);
          this->m_sampleRegister[local_90].depthPassed = fVar8 <= fVar7;
        }
      }
      break;
    case TESTFUNC_GREATER:
      for (local_b0 = 0; local_b0 < 0x40; local_b0 = local_b0 + 1) {
        if ((this->m_sampleRegister[local_b0].isAlive & 1U) != 0) {
          pFVar5 = inputFragments + (fragNdxOffset + local_b0 / numSamplesPerFragment);
          iVar2 = tcu::Vector<int,_2>::x(&pFVar5->pixelCoord);
          iVar3 = tcu::Vector<int,_2>::y(&pFVar5->pixelCoord);
          fVar7 = tcu::ConstPixelBufferAccess::getPixDepth
                            (depthBuffer,local_b0 % numSamplesPerFragment,iVar2,iVar3);
          fVar8 = de::clamp<float>(pFVar5->sampleDepths[local_b0 % numSamplesPerFragment],0.0,1.0);
          this->m_sampleRegister[local_b0].depthPassed = fVar7 < fVar8;
        }
      }
      break;
    case TESTFUNC_GEQUAL:
      for (local_d0 = 0; local_d0 < 0x40; local_d0 = local_d0 + 1) {
        if ((this->m_sampleRegister[local_d0].isAlive & 1U) != 0) {
          pFVar5 = inputFragments + (fragNdxOffset + local_d0 / numSamplesPerFragment);
          iVar2 = tcu::Vector<int,_2>::x(&pFVar5->pixelCoord);
          iVar3 = tcu::Vector<int,_2>::y(&pFVar5->pixelCoord);
          fVar7 = tcu::ConstPixelBufferAccess::getPixDepth
                            (depthBuffer,local_d0 % numSamplesPerFragment,iVar2,iVar3);
          fVar8 = de::clamp<float>(pFVar5->sampleDepths[local_d0 % numSamplesPerFragment],0.0,1.0);
          this->m_sampleRegister[local_d0].depthPassed = fVar7 <= fVar8;
        }
      }
      break;
    case TESTFUNC_EQUAL:
      for (local_f0 = 0; local_f0 < 0x40; local_f0 = local_f0 + 1) {
        if ((this->m_sampleRegister[local_f0].isAlive & 1U) != 0) {
          pFVar5 = inputFragments + (fragNdxOffset + local_f0 / numSamplesPerFragment);
          iVar2 = tcu::Vector<int,_2>::x(&pFVar5->pixelCoord);
          iVar3 = tcu::Vector<int,_2>::y(&pFVar5->pixelCoord);
          fVar7 = tcu::ConstPixelBufferAccess::getPixDepth
                            (depthBuffer,local_f0 % numSamplesPerFragment,iVar2,iVar3);
          fVar8 = de::clamp<float>(pFVar5->sampleDepths[local_f0 % numSamplesPerFragment],0.0,1.0);
          this->m_sampleRegister[local_f0].depthPassed = fVar8 == fVar7;
        }
      }
      break;
    case TESTFUNC_NOTEQUAL:
      for (local_110 = 0; local_110 < 0x40; local_110 = local_110 + 1) {
        if ((this->m_sampleRegister[local_110].isAlive & 1U) != 0) {
          pFVar5 = inputFragments + (fragNdxOffset + local_110 / numSamplesPerFragment);
          iVar2 = tcu::Vector<int,_2>::x(&pFVar5->pixelCoord);
          iVar3 = tcu::Vector<int,_2>::y(&pFVar5->pixelCoord);
          fVar7 = tcu::ConstPixelBufferAccess::getPixDepth
                            (depthBuffer,local_110 % numSamplesPerFragment,iVar2,iVar3);
          fVar8 = de::clamp<float>(pFVar5->sampleDepths[local_110 % numSamplesPerFragment],0.0,1.0);
          this->m_sampleRegister[local_110].depthPassed = fVar8 != fVar7;
        }
      }
    }
  }
  else {
    iVar2 = (int)depthBuffer;
    switch(depthFunc) {
    case TESTFUNC_NEVER:
      for (local_130 = 0; local_130 < 0x40; local_130 = local_130 + 1) {
        if ((this->m_sampleRegister[local_130].isAlive & 1U) != 0) {
          pFVar5 = inputFragments + (fragNdxOffset + local_130 / numSamplesPerFragment);
          iVar3 = tcu::Vector<int,_2>::x(&pFVar5->pixelCoord);
          tcu::Vector<int,_2>::y(&pFVar5->pixelCoord);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)(buffer + 1),iVar2,local_130 % numSamplesPerFragment,
                     iVar3);
          tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)(buffer + 1));
          buffer[0] = (deUint32)pFVar5->sampleDepths[local_130 % numSamplesPerFragment];
          pTVar4 = tcu::ConstPixelBufferAccess::getFormat(depthBuffer);
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_188,pTVar4,1,1,1,
                     &access.super_ConstPixelBufferAccess.m_data);
          tcu::PixelBufferAccess::setPixDepth((PixelBufferAccess *)local_188,(float)buffer[0],0,0,0)
          ;
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)&fragSampleNdx_9,(int)local_188,0,0);
          puVar6 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)&fragSampleNdx_9);
          local_18c = *puVar6;
          this->m_sampleRegister[local_130].depthPassed = false;
        }
      }
      break;
    case TESTFUNC_ALWAYS:
      for (local_1a0 = 0; local_1a0 < 0x40; local_1a0 = local_1a0 + 1) {
        if ((this->m_sampleRegister[local_1a0].isAlive & 1U) != 0) {
          pFVar5 = inputFragments + (fragNdxOffset + local_1a0 / numSamplesPerFragment);
          iVar3 = tcu::Vector<int,_2>::x(&pFVar5->pixelCoord);
          tcu::Vector<int,_2>::y(&pFVar5->pixelCoord);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)(buffer_1 + 1),iVar2,
                     local_1a0 % numSamplesPerFragment,iVar3);
          tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)(buffer_1 + 1));
          buffer_1[0] = (deUint32)pFVar5->sampleDepths[local_1a0 % numSamplesPerFragment];
          pTVar4 = tcu::ConstPixelBufferAccess::getFormat(depthBuffer);
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_1f8,pTVar4,1,1,1,
                     &access_1.super_ConstPixelBufferAccess.m_data);
          tcu::PixelBufferAccess::setPixDepth
                    ((PixelBufferAccess *)local_1f8,(float)buffer_1[0],0,0,0);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)&fragSampleNdx_10,(int)local_1f8,0,0);
          puVar6 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)&fragSampleNdx_10);
          local_1fc = *puVar6;
          this->m_sampleRegister[local_1a0].depthPassed = true;
        }
      }
      break;
    case TESTFUNC_LESS:
      for (local_210 = 0; local_210 < 0x40; local_210 = local_210 + 1) {
        if ((this->m_sampleRegister[local_210].isAlive & 1U) != 0) {
          pFVar5 = inputFragments + (fragNdxOffset + local_210 / numSamplesPerFragment);
          iVar3 = tcu::Vector<int,_2>::x(&pFVar5->pixelCoord);
          tcu::Vector<int,_2>::y(&pFVar5->pixelCoord);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)(buffer_2 + 1),iVar2,
                     local_210 % numSamplesPerFragment,iVar3);
          puVar6 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)(buffer_2 + 1));
          uVar1 = *puVar6;
          buffer_2[0] = (deUint32)pFVar5->sampleDepths[local_210 % numSamplesPerFragment];
          pTVar4 = tcu::ConstPixelBufferAccess::getFormat(depthBuffer);
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_268,pTVar4,1,1,1,
                     &access_2.super_ConstPixelBufferAccess.m_data);
          tcu::PixelBufferAccess::setPixDepth
                    ((PixelBufferAccess *)local_268,(float)buffer_2[0],0,0,0);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)&fragSampleNdx_11,(int)local_268,0,0);
          puVar6 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)&fragSampleNdx_11);
          local_26c = *puVar6;
          this->m_sampleRegister[local_210].depthPassed = local_26c < uVar1;
        }
      }
      break;
    case TESTFUNC_LEQUAL:
      for (local_280 = 0; local_280 < 0x40; local_280 = local_280 + 1) {
        if ((this->m_sampleRegister[local_280].isAlive & 1U) != 0) {
          pFVar5 = inputFragments + (fragNdxOffset + local_280 / numSamplesPerFragment);
          iVar3 = tcu::Vector<int,_2>::x(&pFVar5->pixelCoord);
          tcu::Vector<int,_2>::y(&pFVar5->pixelCoord);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)(buffer_3 + 1),iVar2,
                     local_280 % numSamplesPerFragment,iVar3);
          puVar6 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)(buffer_3 + 1));
          uVar1 = *puVar6;
          buffer_3[0] = (deUint32)pFVar5->sampleDepths[local_280 % numSamplesPerFragment];
          pTVar4 = tcu::ConstPixelBufferAccess::getFormat(depthBuffer);
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_2d8,pTVar4,1,1,1,
                     &access_3.super_ConstPixelBufferAccess.m_data);
          tcu::PixelBufferAccess::setPixDepth
                    ((PixelBufferAccess *)local_2d8,(float)buffer_3[0],0,0,0);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)&fragSampleNdx_12,(int)local_2d8,0,0);
          puVar6 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)&fragSampleNdx_12);
          local_2dc = *puVar6;
          this->m_sampleRegister[local_280].depthPassed = local_2dc <= uVar1;
        }
      }
      break;
    case TESTFUNC_GREATER:
      for (local_2f0 = 0; local_2f0 < 0x40; local_2f0 = local_2f0 + 1) {
        if ((this->m_sampleRegister[local_2f0].isAlive & 1U) != 0) {
          pFVar5 = inputFragments + (fragNdxOffset + local_2f0 / numSamplesPerFragment);
          iVar3 = tcu::Vector<int,_2>::x(&pFVar5->pixelCoord);
          tcu::Vector<int,_2>::y(&pFVar5->pixelCoord);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)(buffer_4 + 1),iVar2,
                     local_2f0 % numSamplesPerFragment,iVar3);
          puVar6 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)(buffer_4 + 1));
          uVar1 = *puVar6;
          buffer_4[0] = (deUint32)pFVar5->sampleDepths[local_2f0 % numSamplesPerFragment];
          pTVar4 = tcu::ConstPixelBufferAccess::getFormat(depthBuffer);
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_348,pTVar4,1,1,1,
                     &access_4.super_ConstPixelBufferAccess.m_data);
          tcu::PixelBufferAccess::setPixDepth
                    ((PixelBufferAccess *)local_348,(float)buffer_4[0],0,0,0);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)&fragSampleNdx_13,(int)local_348,0,0);
          puVar6 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)&fragSampleNdx_13);
          local_34c = *puVar6;
          this->m_sampleRegister[local_2f0].depthPassed = uVar1 < local_34c;
        }
      }
      break;
    case TESTFUNC_GEQUAL:
      for (local_360 = 0; local_360 < 0x40; local_360 = local_360 + 1) {
        if ((this->m_sampleRegister[local_360].isAlive & 1U) != 0) {
          pFVar5 = inputFragments + (fragNdxOffset + local_360 / numSamplesPerFragment);
          iVar3 = tcu::Vector<int,_2>::x(&pFVar5->pixelCoord);
          tcu::Vector<int,_2>::y(&pFVar5->pixelCoord);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)(buffer_5 + 1),iVar2,
                     local_360 % numSamplesPerFragment,iVar3);
          puVar6 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)(buffer_5 + 1));
          uVar1 = *puVar6;
          buffer_5[0] = (deUint32)pFVar5->sampleDepths[local_360 % numSamplesPerFragment];
          pTVar4 = tcu::ConstPixelBufferAccess::getFormat(depthBuffer);
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_3b8,pTVar4,1,1,1,
                     &access_5.super_ConstPixelBufferAccess.m_data);
          tcu::PixelBufferAccess::setPixDepth
                    ((PixelBufferAccess *)local_3b8,(float)buffer_5[0],0,0,0);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)&fragSampleNdx_14,(int)local_3b8,0,0);
          puVar6 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)&fragSampleNdx_14);
          local_3bc = *puVar6;
          this->m_sampleRegister[local_360].depthPassed = uVar1 <= local_3bc;
        }
      }
      break;
    case TESTFUNC_EQUAL:
      for (local_3d0 = 0; local_3d0 < 0x40; local_3d0 = local_3d0 + 1) {
        if ((this->m_sampleRegister[local_3d0].isAlive & 1U) != 0) {
          pFVar5 = inputFragments + (fragNdxOffset + local_3d0 / numSamplesPerFragment);
          iVar3 = tcu::Vector<int,_2>::x(&pFVar5->pixelCoord);
          tcu::Vector<int,_2>::y(&pFVar5->pixelCoord);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)(buffer_6 + 1),iVar2,
                     local_3d0 % numSamplesPerFragment,iVar3);
          puVar6 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)(buffer_6 + 1));
          uVar1 = *puVar6;
          buffer_6[0] = (deUint32)pFVar5->sampleDepths[local_3d0 % numSamplesPerFragment];
          pTVar4 = tcu::ConstPixelBufferAccess::getFormat(depthBuffer);
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_428,pTVar4,1,1,1,
                     &access_6.super_ConstPixelBufferAccess.m_data);
          tcu::PixelBufferAccess::setPixDepth
                    ((PixelBufferAccess *)local_428,(float)buffer_6[0],0,0,0);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)&fragSampleNdx_15,(int)local_428,0,0);
          puVar6 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)&fragSampleNdx_15);
          local_42c = *puVar6;
          this->m_sampleRegister[local_3d0].depthPassed = local_42c == uVar1;
        }
      }
      break;
    case TESTFUNC_NOTEQUAL:
      for (local_440 = 0; local_440 < 0x40; local_440 = local_440 + 1) {
        if ((this->m_sampleRegister[local_440].isAlive & 1U) != 0) {
          pFVar5 = inputFragments + (fragNdxOffset + local_440 / numSamplesPerFragment);
          iVar3 = tcu::Vector<int,_2>::x(&pFVar5->pixelCoord);
          tcu::Vector<int,_2>::y(&pFVar5->pixelCoord);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)(buffer_7 + 1),iVar2,
                     local_440 % numSamplesPerFragment,iVar3);
          puVar6 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)(buffer_7 + 1));
          uVar1 = *puVar6;
          buffer_7[0] = (deUint32)pFVar5->sampleDepths[local_440 % numSamplesPerFragment];
          pTVar4 = tcu::ConstPixelBufferAccess::getFormat(depthBuffer);
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)(local_4ac + 0x14),pTVar4,1,1,1,
                     &access_7.super_ConstPixelBufferAccess.m_data);
          tcu::PixelBufferAccess::setPixDepth
                    ((PixelBufferAccess *)(local_4ac + 0x14),(float)buffer_7[0],0,0,0);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)local_4ac,(int)local_4ac + 0x14,0,0);
          puVar6 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)local_4ac);
          local_4ac._16_4_ = *puVar6;
          this->m_sampleRegister[local_440].depthPassed = local_4ac._16_4_ != uVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void FragmentProcessor::executeDepthCompare (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, TestFunc depthFunc, const tcu::ConstPixelBufferAccess& depthBuffer)
{
#define SAMPLE_REGISTER_DEPTH_COMPARE_F(COMPARE_EXPRESSION)																						\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)																\
	{																																			\
		if (m_sampleRegister[regSampleNdx].isAlive)																								\
		{																																		\
			int					fragSampleNdx		= regSampleNdx % numSamplesPerFragment;														\
			const Fragment&		frag				= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];						\
			float				depthBufferValue	= depthBuffer.getPixDepth(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());			\
			float				sampleDepthFloat	= frag.sampleDepths[fragSampleNdx];															\
			float				sampleDepth			= de::clamp(sampleDepthFloat, 0.0f, 1.0f);													\
																																				\
			m_sampleRegister[regSampleNdx].depthPassed = (COMPARE_EXPRESSION);																	\
																																				\
			DE_UNREF(depthBufferValue);																											\
			DE_UNREF(sampleDepth);																												\
		}																																		\
	}

#define SAMPLE_REGISTER_DEPTH_COMPARE_UI(COMPARE_EXPRESSION)																					\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)																\
	{																																			\
		if (m_sampleRegister[regSampleNdx].isAlive)																								\
		{																																		\
			int					fragSampleNdx		= regSampleNdx % numSamplesPerFragment;														\
			const Fragment&		frag				= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];						\
			deUint32			depthBufferValue	= depthBuffer.getPixelUint(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y()).x();	\
			float				sampleDepthFloat	= frag.sampleDepths[fragSampleNdx];															\
																																				\
			/* Convert input float to target buffer format for comparison */																	\
																																				\
			deUint32 buffer[2];																													\
																																				\
			DE_ASSERT(sizeof(buffer) >= (size_t)depthBuffer.getFormat().getPixelSize());														\
																																				\
			tcu::PixelBufferAccess access(depthBuffer.getFormat(), 1, 1, 1, &buffer);															\
			access.setPixDepth(sampleDepthFloat, 0, 0, 0);																						\
			deUint32 sampleDepth = access.getPixelUint(0, 0, 0).x();																			\
																																				\
			m_sampleRegister[regSampleNdx].depthPassed = (COMPARE_EXPRESSION);																	\
																																				\
			DE_UNREF(depthBufferValue);																											\
			DE_UNREF(sampleDepth);																												\
		}